

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O1

int pkcs12_key_gen(char *pass,size_t pass_len,uint8_t *salt,size_t salt_len,uint8_t id,
                  uint32_t iterations,size_t out_len,uint8_t *out,EVP_MD *md)

{
  int iVar1;
  _func_1088 *__n;
  ulong uVar2;
  _func_1088 *p_Var3;
  EVP_PKEY_CTX *pEVar4;
  _func_1088 *p_Var5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  _func_1088 *p_Var10;
  _func_1088 *p_Var11;
  byte bVar12;
  bool bVar13;
  size_t pass_raw_len;
  uint8_t *pass_raw;
  EVP_MD_CTX ctx;
  uint8_t A [64];
  uint8_t D [128];
  CBS cbs;
  uint local_1e8;
  uint32_t local_1e4;
  ulong local_1e0;
  _func_1088 *local_1d8;
  _func_1088 *local_1d0;
  _func_1088 *local_1c8;
  size_t local_1c0;
  uint8_t *local_1b8;
  _func_1088 *local_1b0;
  EVP_MD_CTX local_1a8;
  uint32_t local_178 [16];
  CBB local_138 [2];
  CBS local_b8 [8];
  undefined4 extraout_var;
  
  if (iterations == 0) {
    ERR_put_error(0x13,0,0x81,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                  ,0x44);
    return 0;
  }
  EVP_MD_CTX_init(&local_1a8);
  local_1b8 = (uint8_t *)0x0;
  local_1c0 = 0;
  if (pass != (char *)0x0) {
    CBB_zero(local_138);
    iVar1 = CBB_init(local_138,pass_len * 2);
    if (iVar1 != 0) {
      local_b8[0].data = (uint8_t *)pass;
      local_b8[0].len = pass_len;
      if (pass_len != 0) {
        do {
          iVar1 = CBS_get_utf8(local_b8,local_178);
          if ((iVar1 == 0) || (iVar1 = CBB_add_ucs2_be(local_138,local_178[0]), iVar1 == 0)) {
            ERR_put_error(0x13,0,0x83,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                          ,0x30);
            goto LAB_0031f310;
          }
        } while (local_b8[0].len != 0);
      }
      iVar9 = 0;
      iVar1 = CBB_add_ucs2_be(local_138,0);
      if (iVar1 != 0) {
        iVar1 = CBB_finish(local_138,&local_1b8,&local_1c0);
        CBB_cleanup(local_138);
        if (iVar1 == 0) {
          p_Var3 = (_func_1088 *)0x0;
          goto LAB_0031f323;
        }
        goto LAB_0031f253;
      }
    }
LAB_0031f310:
    CBB_cleanup(local_138);
    p_Var3 = (_func_1088 *)0x0;
    iVar9 = 0;
    goto LAB_0031f323;
  }
LAB_0031f253:
  iVar1 = EVP_MD_block_size((EVP_MD *)md);
  __n = (_func_1088 *)CONCAT44(extraout_var,iVar1);
  if (__n != (_func_1088 *)0x0) {
    memset(local_138,(uint)id,(size_t)__n);
  }
  p_Var5 = __n + (salt_len - 1);
  if (p_Var5 < salt_len) {
LAB_0031f29f:
    iVar1 = 0x6a;
LAB_0031f2bb:
    ERR_put_error(0x13,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                  ,iVar1);
    uVar8 = 0;
    p_Var3 = (_func_1088 *)0x0;
LAB_0031f2c5:
    iVar9 = 0;
  }
  else {
    local_1a8.update = __n + -1;
    p_Var11 = local_1a8.update + local_1c0;
    if (CARRY8(local_1c0,(ulong)local_1a8.update)) goto LAB_0031f29f;
    uVar7 = (long)p_Var5 - (long)((ulong)p_Var5 % (ulong)__n);
    uVar2 = (long)p_Var11 - (long)((ulong)p_Var11 % (ulong)__n);
    p_Var10 = (_func_1088 *)(uVar2 + uVar7);
    local_1e4 = iterations;
    if (CARRY8(uVar2,uVar7)) {
      iVar1 = 0x71;
      goto LAB_0031f2bb;
    }
    local_1e0 = uVar2;
    local_1d8 = (_func_1088 *)((ulong)p_Var5 % (ulong)__n);
    local_1c8 = (_func_1088 *)((ulong)p_Var11 % (ulong)__n);
    p_Var3 = (_func_1088 *)OPENSSL_malloc((size_t)p_Var10);
    local_1d0 = p_Var3;
    local_1b0 = p_Var10;
    if (p_Var10 != (_func_1088 *)0x0 && p_Var3 == (_func_1088 *)0x0) {
      uVar8 = 0;
      p_Var3 = (_func_1088 *)0x0;
      goto LAB_0031f2c5;
    }
    if (p_Var5 != local_1d8) {
      uVar2 = 0;
      do {
        p_Var3[uVar2] = (_func_1088)salt[uVar2 % salt_len];
        uVar2 = uVar2 + 1;
      } while (uVar2 < uVar7);
    }
    if (p_Var11 != local_1c8) {
      uVar2 = 0;
      do {
        p_Var3[uVar2 + uVar7] = (_func_1088)local_1b8[uVar2 % local_1c0];
        uVar2 = uVar2 + 1;
      } while (uVar2 < local_1e0);
    }
    local_1e0 = out_len;
    bVar13 = local_1e4 != 1;
    uVar8 = 2;
    if (2 < local_1e4) {
      uVar8 = local_1e4;
    }
    local_1c8 = (_func_1088 *)CONCAT44(local_1c8._4_4_,uVar8);
    local_1a8.pctx = (EVP_PKEY_CTX *)(__n + (__n == (_func_1088 *)0x0));
    do {
      iVar9 = 1;
      if (local_1e0 == 0) goto LAB_0031f727;
      iVar1 = EVP_DigestInit_ex(&local_1a8,(EVP_MD *)md,(ENGINE *)0x0);
      uVar8 = 2;
      if ((((iVar1 != 0) && (iVar1 = EVP_DigestUpdate(&local_1a8,local_138,(size_t)__n), iVar1 != 0)
           ) && (iVar1 = EVP_DigestUpdate(&local_1a8,p_Var3,(size_t)local_1b0), iVar1 != 0)) &&
         (iVar1 = EVP_DigestFinal_ex(&local_1a8,(uchar *)local_178,&local_1e8), iVar1 != 0)) {
        uVar8 = 0xb;
        bVar12 = bVar13;
        if (local_1e4 != 1) {
          iVar1 = EVP_DigestInit_ex(&local_1a8,(EVP_MD *)md,(ENGINE *)0x0);
          uVar8 = 2;
          if (iVar1 != 0) {
            uVar6 = 2;
            do {
              local_1d8 = (_func_1088 *)CONCAT71(local_1d8._1_7_,bVar12);
              iVar1 = EVP_DigestUpdate(&local_1a8,local_178,(ulong)local_1e8);
              if ((iVar1 == 0) ||
                 (iVar1 = EVP_DigestFinal_ex(&local_1a8,(uchar *)local_178,&local_1e8), iVar1 == 0))
              {
                bVar12 = (byte)local_1d8;
                break;
              }
              bVar12 = uVar6 < local_1e4;
              if ((uint)local_1c8 == uVar6) {
                uVar8 = 0xb;
                break;
              }
              iVar1 = EVP_DigestInit_ex(&local_1a8,(EVP_MD *)md,(ENGINE *)0x0);
              uVar6 = uVar6 + 1;
            } while (iVar1 != 0);
          }
        }
        p_Var3 = local_1d0;
        if ((bVar12 & 1) == 0) {
          uVar7 = (ulong)local_1e8;
          uVar2 = uVar7;
          if (local_1e0 < uVar7) {
            uVar2 = local_1e0;
          }
          if (uVar7 != 0) {
            memcpy(out,local_178,uVar2);
          }
          out = out + uVar2;
          local_1e0 = local_1e0 - uVar2;
          if (local_1e0 == 0) {
            uVar8 = 10;
          }
          else {
            pEVar4 = (EVP_PKEY_CTX *)0x0;
            do {
              pEVar4[(long)&local_b8[0].data] =
                   *(EVP_PKEY_CTX *)((long)local_178 + (ulong)pEVar4 % (ulong)local_1e8);
              pEVar4 = pEVar4 + 1;
            } while (local_1a8.pctx != pEVar4);
            if ((ulong)local_1b0 % (ulong)__n != 0) {
              __assert_fail("I_len % block_size == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                            ,0xa6,
                            "int pkcs12_key_gen(const char *, size_t, const uint8_t *, size_t, uint8_t, uint32_t, size_t, uint8_t *, const EVP_MD *)"
                           );
            }
            if (local_1b0 != (_func_1088 *)0x0) {
              p_Var11 = (_func_1088 *)0x0;
              p_Var5 = local_1d0;
              do {
                uVar8 = 1;
                p_Var10 = local_1a8.update;
                do {
                  uVar8 = (uint)(byte)p_Var10[(long)&local_b8[0].data] +
                          (byte)p_Var5[(long)p_Var10] + uVar8;
                  p_Var5[(long)p_Var10] = SUB41(uVar8,0);
                  uVar8 = uVar8 >> 8;
                  p_Var10 = p_Var10 + -1;
                } while (p_Var10 < __n);
                p_Var11 = p_Var11 + (long)__n;
                p_Var5 = p_Var5 + (long)__n;
              } while (p_Var11 < local_1b0);
            }
            uVar8 = 0;
          }
        }
      }
    } while (uVar8 == 0);
    if (uVar8 != 10) goto LAB_0031f2c5;
LAB_0031f727:
    uVar8 = 0;
  }
  if ((uVar8 & 0xd) != 0) {
    return iVar9;
  }
LAB_0031f323:
  OPENSSL_free(p_Var3);
  OPENSSL_free(local_1b8);
  EVP_MD_CTX_cleanup(&local_1a8);
  return iVar9;
}

Assistant:

int pkcs12_key_gen(const char *pass, size_t pass_len, const uint8_t *salt,
                   size_t salt_len, uint8_t id, uint32_t iterations,
                   size_t out_len, uint8_t *out, const EVP_MD *md) {
  // See https://tools.ietf.org/html/rfc7292#appendix-B. Quoted parts of the
  // specification have errata applied and other typos fixed.

  if (iterations < 1) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_ITERATION_COUNT);
    return 0;
  }

  int ret = 0;
  EVP_MD_CTX ctx;
  EVP_MD_CTX_init(&ctx);
  uint8_t *pass_raw = NULL, *I = NULL;
  size_t pass_raw_len = 0, I_len = 0;

  {
    // If |pass| is NULL, we use the empty string rather than {0, 0} as the raw
    // password.
    if (pass != NULL &&
        !pkcs12_encode_password(pass, pass_len, &pass_raw, &pass_raw_len)) {
      goto err;
    }

    // In the spec, |block_size| is called "v", but measured in bits.
    size_t block_size = EVP_MD_block_size(md);

    // 1. Construct a string, D (the "diversifier"), by concatenating v/8 copies
    // of ID.
    uint8_t D[EVP_MAX_MD_BLOCK_SIZE];
    OPENSSL_memset(D, id, block_size);

    // 2. Concatenate copies of the salt together to create a string S of length
    // v(ceiling(s/v)) bits (the final copy of the salt may be truncated to
    // create S). Note that if the salt is the empty string, then so is S.
    //
    // 3. Concatenate copies of the password together to create a string P of
    // length v(ceiling(p/v)) bits (the final copy of the password may be
    // truncated to create P).  Note that if the password is the empty string,
    // then so is P.
    //
    // 4. Set I=S||P to be the concatenation of S and P.
    if (salt_len + block_size - 1 < salt_len ||
        pass_raw_len + block_size - 1 < pass_raw_len) {
      OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
      goto err;
    }
    size_t S_len = block_size * ((salt_len + block_size - 1) / block_size);
    size_t P_len = block_size * ((pass_raw_len + block_size - 1) / block_size);
    I_len = S_len + P_len;
    if (I_len < S_len) {
      OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
      goto err;
    }

    I = reinterpret_cast<uint8_t *>(OPENSSL_malloc(I_len));
    if (I_len != 0 && I == NULL) {
      goto err;
    }

    for (size_t i = 0; i < S_len; i++) {
      I[i] = salt[i % salt_len];
    }
    for (size_t i = 0; i < P_len; i++) {
      I[i + S_len] = pass_raw[i % pass_raw_len];
    }

    while (out_len != 0) {
      // A. Set A_i=H^r(D||I). (i.e., the r-th hash of D||I,
      // H(H(H(... H(D||I))))
      uint8_t A[EVP_MAX_MD_SIZE];
      unsigned A_len;
      if (!EVP_DigestInit_ex(&ctx, md, NULL) ||
          !EVP_DigestUpdate(&ctx, D, block_size) ||
          !EVP_DigestUpdate(&ctx, I, I_len) ||
          !EVP_DigestFinal_ex(&ctx, A, &A_len)) {
        goto err;
      }
      for (uint32_t iter = 1; iter < iterations; iter++) {
        if (!EVP_DigestInit_ex(&ctx, md, NULL) ||
            !EVP_DigestUpdate(&ctx, A, A_len) ||
            !EVP_DigestFinal_ex(&ctx, A, &A_len)) {
          goto err;
        }
      }

      size_t todo = out_len < A_len ? out_len : A_len;
      OPENSSL_memcpy(out, A, todo);
      out += todo;
      out_len -= todo;
      if (out_len == 0) {
        break;
      }

      // B. Concatenate copies of A_i to create a string B of length v bits (the
      // final copy of A_i may be truncated to create B).
      uint8_t B[EVP_MAX_MD_BLOCK_SIZE];
      for (size_t i = 0; i < block_size; i++) {
        B[i] = A[i % A_len];
      }

      // C. Treating I as a concatenation I_0, I_1, ..., I_(k-1) of v-bit
      // blocks, where k=ceiling(s/v)+ceiling(p/v), modify I by setting
      // I_j=(I_j+B+1) mod 2^v for each j.
      assert(I_len % block_size == 0);
      for (size_t i = 0; i < I_len; i += block_size) {
        unsigned carry = 1;
        for (size_t j = block_size - 1; j < block_size; j--) {
          carry += I[i + j] + B[j];
          I[i + j] = (uint8_t)carry;
          carry >>= 8;
        }
      }
    }

    ret = 1;
  }

err:
  OPENSSL_free(I);
  OPENSSL_free(pass_raw);
  EVP_MD_CTX_cleanup(&ctx);
  return ret;
}